

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qthreadpool.cpp
# Opt level: O0

QThreadPool * QThreadPool::globalInstance(void)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  QThreadPool *pQVar4;
  long in_FS_OFFSET;
  QObject *unaff_retaddr;
  QThreadPool *in_stack_00000008;
  QMutexLocker<QBasicMutex> locker;
  QThreadPool *in_stack_ffffffffffffffb8;
  QMutexLocker<QBasicMutex> *in_stack_ffffffffffffffc0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((globalInstance()::theInstance == '\0') &&
     (iVar3 = __cxa_guard_acquire(&globalInstance()::theInstance), iVar3 != 0)) {
    __cxa_atexit(QPointer<QThreadPool>::~QPointer,&globalInstance::theInstance,&__dso_handle);
    __cxa_guard_release(&globalInstance()::theInstance);
  }
  QMutexLocker<QBasicMutex>::QMutexLocker
            (in_stack_ffffffffffffffc0,(QBasicMutex *)in_stack_ffffffffffffffb8);
  bVar2 = QPointer<QThreadPool>::isNull((QPointer<QThreadPool> *)0x6cbd8b);
  if ((bVar2) && (bVar2 = QCoreApplication::closingDown(), !bVar2)) {
    operator_new(0x10);
    QThreadPool(in_stack_00000008,unaff_retaddr);
    QPointer<QThreadPool>::operator=
              ((QPointer<QThreadPool> *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  }
  pQVar4 = QPointer::operator_cast_to_QThreadPool_((QPointer<QThreadPool> *)0x6cbe22);
  QMutexLocker<QBasicMutex>::~QMutexLocker(in_stack_ffffffffffffffc0);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return pQVar4;
}

Assistant:

QThreadPool *QThreadPool::globalInstance()
{
    Q_CONSTINIT static QPointer<QThreadPool> theInstance;
    Q_CONSTINIT static QBasicMutex theMutex;

    const QMutexLocker locker(&theMutex);
    if (theInstance.isNull() && !QCoreApplication::closingDown())
        theInstance = new QThreadPool();
    return theInstance;
}